

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall spirv_cross::ParsedIR::remove_typed_id(ParsedIR *this,Types type,ID id)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__cont;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *type_ids;
  Types type_local;
  ParsedIR *this_local;
  ID id_local;
  
  __cont = this->ids_for_type + type;
  this_local._4_4_ = id.id;
  pTVar1 = ::std::begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                     (__cont);
  pTVar2 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                     (__cont);
  pTVar1 = ::std::
           remove<spirv_cross::TypedID<(spirv_cross::Types)0>*,spirv_cross::TypedID<(spirv_cross::Types)0>>
                     (pTVar1,pTVar2,(TypedID<(spirv_cross::Types)0> *)((long)&this_local + 4));
  pTVar2 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                     (__cont);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase(__cont,pTVar1,pTVar2);
  return;
}

Assistant:

void ParsedIR::remove_typed_id(Types type, ID id)
{
	auto &type_ids = ids_for_type[type];
	type_ids.erase(remove(begin(type_ids), end(type_ids), id), end(type_ids));
}